

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O3

void Gia_ManComputeDoms(Gia_Man_t *p)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  
  pVVar7 = p->vDoms;
  if (pVVar7 == (Vec_Int_t *)0x0) {
    pVVar7 = (Vec_Int_t *)calloc(1,0x10);
    p->vDoms = pVVar7;
    iVar6 = 0;
  }
  else {
    iVar6 = pVVar7->nCap;
  }
  uVar5 = p->nObjs;
  if (iVar6 < (int)uVar5) {
    if (pVVar7->pArray == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar5 << 2);
    }
    else {
      piVar8 = (int *)realloc(pVVar7->pArray,(long)(int)uVar5 << 2);
    }
    pVVar7->pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar7->nCap = uVar5;
  }
  if (0 < (int)uVar5) {
    memset(pVVar7->pArray,0xff,(ulong)uVar5 * 4);
  }
  pVVar7->nSize = uVar5;
  uVar5 = p->nObjs;
  if ((int)uVar5 < 1) {
    return;
  }
  if ((int)uVar5 <= p->nObjs) {
    uVar12 = (ulong)uVar5;
    lVar4 = (ulong)uVar5 * 0xc;
    do {
      lVar11 = lVar4 + -0xc;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) {
        return;
      }
      if (uVar12 == 1) {
        return;
      }
      uVar1 = uVar12 - 1;
      uVar3 = *(ulong *)(&pGVar2[-1].field_0x0 + lVar4);
      uVar5 = (uint)uVar3;
      if (((byte)(uVar3 >> 0x3e) & 1) == 0 && (~uVar5 & 0x9fffffff) != 0) {
        uVar10 = uVar5 & 0x80000000;
        if (p->pRefs == (int *)0x0) {
          uVar9 = (ulong)(uVar5 & 0x1fffffff);
LAB_00623c61:
          iVar6 = (int)uVar9;
          bVar13 = uVar9 != 0x1fffffff;
          if (!bVar13 || (uVar3 & 0x80000000) == 0) goto LAB_00623ca0;
          if ((long)p->vDoms->nSize < (long)uVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          iVar6 = (int)uVar12 + -1;
          p->vDoms->pArray[uVar12 - 1] = iVar6;
          uVar5 = (uint)*(undefined8 *)(&pGVar2[-1].field_0x0 + lVar4);
        }
        else {
          uVar9 = uVar3 & 0x1fffffff;
          iVar6 = (int)uVar9;
          if (uVar9 == 0x1fffffff || (uVar3 & 0x80000000) != 0) goto LAB_00623c61;
          if (p->pRefs[uVar12 - 1] == 0) goto LAB_00623cea;
          bVar13 = true;
          uVar10 = 0;
LAB_00623ca0:
          if ((uVar10 != 0) || (!bVar13)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                          ,0x69,"void Gia_ManComputeDoms(Gia_Man_t *)");
          }
          Gia_ManAddDom(p,(Gia_Obj_t *)((long)pGVar2 + (ulong)(uint)(iVar6 << 2) * -3 + lVar11),
                        (int)uVar12 + -1);
          uVar5 = *(uint *)(&pGVar2[-1].field_0x4 + lVar4);
          iVar6 = (int)uVar1;
        }
        Gia_ManAddDom(p,(Gia_Obj_t *)
                        ((long)pGVar2 + lVar11 + (ulong)((uVar5 & 0x1fffffff) << 2) * -3),iVar6);
      }
LAB_00623cea:
      uVar12 = uVar1;
      lVar4 = lVar11;
    } while ((long)uVar1 <= (long)p->nObjs);
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManComputeDoms( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->vDoms == NULL )
        p->vDoms = Vec_IntAlloc( 0 );
    Vec_IntFill( p->vDoms, Gia_ManObjNum(p), -1 );
    Gia_ManForEachObjReverse( p, pObj, i )
    {
        if ( i == 0 || Gia_ObjIsCi(pObj) )
            continue;
        if ( pObj->fMark1 || (p->pRefs && Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p, pObj) == 0) )
            continue;
        if ( Gia_ObjIsCo(pObj) )
        {
            Gia_ObjSetDom( p, pObj, i );
            Gia_ManAddDom( p, Gia_ObjFanin0(pObj), i );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        Gia_ManAddDom( p, Gia_ObjFanin0(pObj), i );
        Gia_ManAddDom( p, Gia_ObjFanin1(pObj), i );
    }
}